

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ExplosionDescriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ExplosionDescriptor *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  ExplosionDescriptor *local_18;
  ExplosionDescriptor *this_local;
  
  local_18 = this;
  this_local = (ExplosionDescriptor *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Descriptor:");
  poVar1 = std::operator<<(poVar1,"\n\tType:     ");
  EntityType::GetAsString_abi_cxx11_(&local_1d0,&(this->super_Descriptor).m_Type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tMaterial: ");
  ENUMS::GetEnumAsStringExplosiveMaterial_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui16ExplMat,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tForce:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32ExplForce);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ExplosionDescriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType:     " << m_Type.GetAsString()
       << "\tMaterial: "   << GetEnumAsStringExplosiveMaterial( m_ui16ExplMat )
       << "\n\tForce:    " << m_f32ExplForce       
       << "\n";

    return ss.str();
}